

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Buf_ManStop(Buf_Man_t *p)

{
  int iVar1;
  Vec_Que_t *__ptr;
  Vec_Flt_t *__ptr_00;
  
  printf("Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ",(ulong)(uint)p->nSeparate,
         (ulong)(uint)p->nDuplicate,(ulong)(uint)p->nBranch0,(ulong)(uint)p->nBranch1,
         (ulong)(uint)p->nBranchCrit);
  iVar1 = p->pNtk->vObjs->nSize;
  printf("Orig = %d. Add = %d. Rem = %d.\n",(ulong)(uint)p->nObjStart,
         (ulong)(uint)(iVar1 - p->nObjStart),(ulong)(uint)(p->nObjAlloc - iVar1));
  Vec_PtrFree(p->vFanouts);
  Vec_IntFree(p->vTfCone);
  Vec_IntFree(p->vNonCrit);
  Vec_IntFree(p->vDelays);
  Vec_IntFree(p->vOrder);
  Vec_IntFree(p->vOffsets);
  Vec_IntFree(p->vEdges);
  Vec_IntFree(p->vArr);
  Vec_IntFree(p->vDep);
  __ptr = p->vQue;
  if (__ptr->pOrder != (int *)0x0) {
    free(__ptr->pOrder);
    __ptr->pOrder = (int *)0x0;
  }
  free(__ptr->pHeap);
  free(__ptr);
  __ptr_00 = p->vCounts;
  free(__ptr_00->pArray);
  free(__ptr_00);
  free(p);
  return;
}

Assistant:

void Buf_ManStop( Buf_Man_t * p )
{
    printf( "Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ", 
        p->nSeparate, p->nDuplicate, p->nBranch0, p->nBranch1, p->nBranchCrit );
    printf( "Orig = %d. Add = %d. Rem = %d.\n", 
        p->nObjStart, Abc_NtkObjNumMax(p->pNtk) - p->nObjStart, 
        p->nObjAlloc - Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrFree( p->vFanouts );
    Vec_IntFree( p->vTfCone );
    Vec_IntFree( p->vNonCrit );
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vOrder );
    Vec_IntFree( p->vOffsets );
    Vec_IntFree( p->vEdges );
    Vec_IntFree( p->vArr );
    Vec_IntFree( p->vDep );
//    Vec_QueCheck( p->vQue );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    ABC_FREE( p );
}